

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffomem(fitsfile **fptr,char *name,int mode,void **buffptr,size_t *buffsize,size_t deltasize,
          _func_void_ptr_void_ptr_size_t *mem_realloc,int *status)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  void **in_RCX;
  undefined4 in_EDX;
  int *in_RSI;
  long *in_RDI;
  size_t *in_R8;
  size_t in_R9;
  _func_void_ptr_void_ptr_size_t *in_stack_00000008;
  fitsfile *in_stack_00000010;
  char *hdtype [3];
  char errmsg [81];
  char *url;
  char rowexpress [1025];
  char imagecolname [71];
  char colspec [1025];
  char binspec [1025];
  char rowfilter [1025];
  char extspec [1025];
  char outfile [1025];
  char infile [1025];
  char urltype [20];
  LONGLONG filesize;
  char extname [71];
  int extnum;
  int extvers;
  int movetotype;
  int slen;
  int hdutyp;
  int handle;
  int driver;
  int ii;
  int *driver_00;
  fitsfile *fptr_00;
  undefined4 in_stack_ffffffffffffe1f0;
  char *pcVar5;
  char *rowfilterx;
  char *fptr_01;
  char *in_stack_ffffffffffffe210;
  char *in_stack_ffffffffffffe218;
  char *in_stack_ffffffffffffe220;
  char *in_stack_ffffffffffffe228;
  int *in_stack_ffffffffffffe240;
  int *in_stack_ffffffffffffe248;
  undefined4 in_stack_ffffffffffffe250;
  int in_stack_ffffffffffffe254;
  fitsfile *in_stack_ffffffffffffe258;
  undefined4 in_stack_ffffffffffffe260;
  int in_stack_ffffffffffffe264;
  fitsfile *in_stack_ffffffffffffe268;
  uint7 in_stack_ffffffffffffe279;
  char *in_stack_ffffffffffffe290;
  int *in_stack_ffffffffffffe298;
  int *in_stack_ffffffffffffe398;
  int *in_stack_ffffffffffffe3a0;
  fitsfile *in_stack_ffffffffffffe3a8;
  int local_1928 [780];
  char local_cf8;
  char local_c8 [24];
  LONGLONG local_b0;
  char local_a8 [80];
  uint local_58;
  uint local_54;
  int local_50;
  int local_4c;
  int local_44;
  int local_40;
  int local_3c;
  size_t local_38;
  size_t *local_30;
  void **local_28;
  undefined4 local_1c;
  int *local_18;
  long *local_10;
  int local_4;
  
  pcVar5 = "IMAGE";
  rowfilterx = "TABLE";
  fptr_01 = "BINTABLE";
  if (in_stack_00000010->HDUposition < 1) {
    *in_RDI = 0;
    local_10 = in_RDI;
    local_1c = in_EDX;
    local_28 = in_RCX;
    local_30 = in_R8;
    local_38 = in_R9;
    if (need_to_initialize != 0) {
      local_18 = in_RSI;
      iVar1 = fits_init_cfitsio();
      in_stack_00000010->HDUposition = iVar1;
      in_RSI = local_18;
      if (0 < in_stack_00000010->HDUposition) {
        return in_stack_00000010->HDUposition;
      }
    }
    for (; iVar1 = (int)((ulong)pcVar5 >> 0x20), (char)*in_RSI == ' ';
        in_RSI = (int *)((long)in_RSI + 1)) {
    }
    driver_00 = local_1928;
    fptr_00 = in_stack_00000010;
    ffiurl(in_stack_ffffffffffffe228,in_stack_ffffffffffffe220,in_stack_ffffffffffffe218,
           in_stack_ffffffffffffe210,fptr_01,rowfilterx,(char *)in_stack_ffffffffffffe240,
           (char *)in_stack_ffffffffffffe248,
           (int *)CONCAT44(in_stack_ffffffffffffe254,in_stack_ffffffffffffe250));
    strcpy(local_c8,"memkeep://");
    iVar2 = urltype2driver((char *)fptr_00,driver_00);
    in_stack_00000010->HDUposition = iVar2;
    if (in_stack_00000010->HDUposition < 1) {
      iVar2 = mem_openmem(local_28,local_30,local_38,in_stack_00000008,&local_44);
      in_stack_00000010->HDUposition = iVar2;
      if (in_stack_00000010->HDUposition < 1) {
        iVar2 = (*driverTable[local_40].size)(local_44,&local_b0);
        in_stack_00000010->HDUposition = iVar2;
        if (in_stack_00000010->HDUposition < 1) {
          pvVar3 = calloc(1,0x10);
          *local_10 = (long)pvVar3;
          if (*local_10 == 0) {
            (*driverTable[local_40].close)(local_44);
            ffpmsg((char *)0x107564);
            ffpmsg((char *)0x107571);
            in_stack_00000010->HDUposition = 0x71;
            local_4 = 0x71;
          }
          else {
            pvVar3 = calloc(1,0x7e8);
            *(void **)(*local_10 + 8) = pvVar3;
            if (*(long *)(*local_10 + 8) == 0) {
              (*driverTable[local_40].close)(local_44);
              ffpmsg((char *)0x1075f4);
              ffpmsg((char *)0x107601);
              free((void *)*local_10);
              *local_10 = 0;
              in_stack_00000010->HDUposition = 0x71;
              local_4 = 0x71;
            }
            else {
              sVar4 = strlen((char *)in_RSI);
              iVar2 = (int)sVar4 + 1;
              if (iVar2 < 0x21) {
                iVar2 = 0x20;
              }
              local_4c = iVar2;
              pvVar3 = malloc((long)iVar2);
              *(void **)(*(long *)(*local_10 + 8) + 0x10) = pvVar3;
              if (*(long *)(*(long *)(*local_10 + 8) + 0x10) == 0) {
                (*driverTable[local_40].close)(local_44);
                ffpmsg((char *)0x1076f2);
                ffpmsg((char *)0x1076ff);
                free(*(void **)(*local_10 + 8));
                free((void *)*local_10);
                *local_10 = 0;
                in_stack_00000010->HDUposition = 0x71;
                local_4 = 0x71;
              }
              else {
                pvVar3 = calloc(0x3e9,8);
                *(void **)(*(long *)(*local_10 + 8) + 0x68) = pvVar3;
                if (*(long *)(*(long *)(*local_10 + 8) + 0x68) == 0) {
                  (*driverTable[local_40].close)(local_44);
                  ffpmsg((char *)0x1077c1);
                  ffpmsg((char *)0x1077ce);
                  free(*(void **)(*(long *)(*local_10 + 8) + 0x10));
                  free(*(void **)(*local_10 + 8));
                  free((void *)*local_10);
                  *local_10 = 0;
                  in_stack_00000010->HDUposition = 0x71;
                  local_4 = 0x71;
                }
                else {
                  pvVar3 = calloc(0x28,0xb40);
                  *(void **)(*(long *)(*local_10 + 8) + 0x560) = pvVar3;
                  if (*(long *)(*(long *)(*local_10 + 8) + 0x560) == 0) {
                    (*driverTable[local_40].close)(local_44);
                    ffpmsg((char *)0x1078ae);
                    ffpmsg((char *)0x1078bb);
                    free(*(void **)(*(long *)(*local_10 + 8) + 0x68));
                    free(*(void **)(*(long *)(*local_10 + 8) + 0x10));
                    free(*(void **)(*local_10 + 8));
                    free((void *)*local_10);
                    *local_10 = 0;
                    in_stack_00000010->HDUposition = 0x71;
                    local_4 = 0x71;
                  }
                  else {
                    for (local_3c = 0; local_3c < 0x28; local_3c = local_3c + 1) {
                      *(int *)(*(long *)(*local_10 + 8) + 0x748 + (long)local_3c * 4) = local_3c;
                      *(undefined8 *)(*(long *)(*local_10 + 8) + 0x568 + (long)local_3c * 8) =
                           0xffffffffffffffff;
                    }
                    *(undefined4 *)(*(long *)(*local_10 + 8) + 100) = 1000;
                    **(int **)(*local_10 + 8) = local_44;
                    *(int *)(*(long *)(*local_10 + 8) + 4) = local_40;
                    strcpy(*(char **)(*(long *)(*local_10 + 8) + 0x10),(char *)in_RSI);
                    *(LONGLONG *)(*(long *)(*local_10 + 8) + 0x28) = local_b0;
                    *(LONGLONG *)(*(long *)(*local_10 + 8) + 0x30) = local_b0;
                    *(undefined4 *)(*(long *)(*local_10 + 8) + 0x5c) = local_1c;
                    *(undefined8 *)(*(long *)(*local_10 + 8) + 0x88) = 0xffffffffffffffff;
                    *(undefined4 *)(*(long *)(*local_10 + 8) + 0x50) = 0xffffffff;
                    *(undefined4 *)(*(long *)(*local_10 + 8) + 8) = 1;
                    *(undefined4 *)(*(long *)(*local_10 + 8) + 0x18) = 0x22b;
                    *(undefined4 *)(*(long *)(*local_10 + 8) + 0x20) = 0;
                    ffldrc((fitsfile *)fptr_01,(long)rowfilterx,iVar1,
                           (int *)CONCAT44(iVar2,in_stack_ffffffffffffe1f0));
                    fits_store_Fptr(*(FITSfile **)(*local_10 + 8),&in_stack_00000010->HDUposition);
                    iVar1 = ffrhdu(in_stack_ffffffffffffe3a8,in_stack_ffffffffffffe3a0,
                                   in_stack_ffffffffffffe398);
                    if (0 < iVar1) {
                      ffpmsg((char *)0x107b3f);
                      ffpmsg((char *)0x107b4c);
                      if (in_stack_00000010->HDUposition == 0xfc) {
                        ffpmsg((char *)0x107b68);
                      }
                      ffclos(fptr_00,driver_00);
                      *local_10 = 0;
                    }
                    if (local_cf8 != '\0') {
                      ffexts((char *)((ulong)in_stack_ffffffffffffe279 << 8),in_RSI,
                             (char *)in_stack_ffffffffffffe268,
                             (int *)CONCAT44(in_stack_ffffffffffffe264,in_stack_ffffffffffffe260),
                             &in_stack_ffffffffffffe258->HDUposition,
                             (char *)CONCAT44(in_stack_ffffffffffffe254,in_stack_ffffffffffffe250),
                             in_stack_ffffffffffffe290,in_stack_ffffffffffffe298);
                      if (0 < in_stack_00000010->HDUposition) {
                        return in_stack_00000010->HDUposition;
                      }
                      if (local_58 == 0) {
                        if (local_a8[0] != '\0') {
                          ffmnhd(in_stack_ffffffffffffe268,in_stack_ffffffffffffe264,
                                 (char *)in_stack_ffffffffffffe258,in_stack_ffffffffffffe254,
                                 in_stack_ffffffffffffe248);
                        }
                      }
                      else {
                        ffmahd(in_stack_ffffffffffffe258,in_stack_ffffffffffffe254,
                               in_stack_ffffffffffffe248,in_stack_ffffffffffffe240);
                      }
                      if (0 < in_stack_00000010->HDUposition) {
                        ffpmsg((char *)0x107cab);
                        if ((int)local_58 < 1) {
                          snprintf(&stack0xffffffffffffe218,0x51," extension with EXTNAME = %s,",
                                   local_a8);
                          ffpmsg((char *)0x107d0d);
                          if (local_54 != 0) {
                            snprintf(&stack0xffffffffffffe218,0x51,
                                     "           and with EXTVERS = %d,",(ulong)local_54);
                            ffpmsg((char *)0x107d40);
                          }
                          if (local_50 != -1) {
                            snprintf(&stack0xffffffffffffe218,0x51,
                                     "           and with XTENSION = %s,",
                                     *(undefined8 *)(&stack0xffffffffffffe1f8 + (long)local_50 * 8))
                            ;
                            ffpmsg((char *)0x107d79);
                          }
                          ffpmsg((char *)0x107d85);
                        }
                        else {
                          snprintf(&stack0xffffffffffffe218,0x51,
                                   " extension number %d doesn\'t exist or couldn\'t be opened.",
                                   (ulong)local_58);
                          ffpmsg((char *)0x107cde);
                        }
                        return in_stack_00000010->HDUposition;
                      }
                    }
                    local_4 = in_stack_00000010->HDUposition;
                  }
                }
              }
            }
          }
        }
        else {
          (*driverTable[local_40].close)(local_44);
          ffpmsg((char *)0x1074f1);
          local_4 = in_stack_00000010->HDUposition;
        }
      }
      else {
        ffpmsg((char *)0x107462);
        local_4 = in_stack_00000010->HDUposition;
      }
    }
    else {
      ffpmsg((char *)0x1073fa);
      local_4 = in_stack_00000010->HDUposition;
    }
  }
  else {
    local_4 = in_stack_00000010->HDUposition;
  }
  return local_4;
}

Assistant:

int ffomem(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - name of file to open                */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           void **buffptr,       /* I - address of memory pointer           */
           size_t *buffsize,     /* I - size of buffer, in bytes            */
           size_t deltasize,     /* I - increment for future realloc's      */
           void *(*mem_realloc)(void *p, size_t newsize), /* function       */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file in core memory.  This is a specialized version
  of ffopen.
*/
{
    int ii, driver, handle, hdutyp, slen, movetotype, extvers, extnum;
    char extname[FLEN_VALUE];
    LONGLONG filesize;
    char urltype[MAX_PREFIX_LEN], infile[FLEN_FILENAME], outfile[FLEN_FILENAME];
    char extspec[FLEN_FILENAME], rowfilter[FLEN_FILENAME];
    char binspec[FLEN_FILENAME], colspec[FLEN_FILENAME];
    char imagecolname[FLEN_VALUE], rowexpress[FLEN_FILENAME];
    char *url, errmsg[FLEN_ERRMSG];
    char *hdtype[3] = {"IMAGE", "TABLE", "BINTABLE"};

    if (*status > 0)
        return(*status);

    *fptr = 0;                   /* initialize null file pointer */

    if (need_to_initialize)           /* this is called only once */
    {
        *status = fits_init_cfitsio();

        if (*status > 0)
            return(*status);
    }

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the file spec */
        url++;

        /* parse the input file specification */
    fits_parse_input_url(url, urltype, infile, outfile, extspec,
              rowfilter, binspec, colspec, status);

    strcpy(urltype, "memkeep://");   /* URL type for pre-existing memory file */

    *status = urltype2driver(urltype, &driver);

    if (*status > 0)
    {
        ffpmsg("could not find driver for pre-existing memory file: (ffomem)");
        return(*status);
    }

    /* call driver routine to open the memory file */
    FFLOCK;  /* lock this while searching for vacant handle */
    *status =   mem_openmem( buffptr, buffsize,deltasize,
                            mem_realloc,  &handle);
    FFUNLOCK;

    if (*status > 0)
    {
         ffpmsg("failed to open pre-existing memory file: (ffomem)");
         return(*status);
    }

        /* get initial file size */
    *status = (*driverTable[driver].size)(handle, &filesize);

    if (*status > 0)
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed get the size of the memory file: (ffomem)");
        return(*status);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffomem)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffomem)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffomem)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* file handle */
    ((*fptr)->Fptr)->driver = driver;            /* driver number */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename */
    ((*fptr)->Fptr)->filesize = filesize;        /* physical file size */
    ((*fptr)->Fptr)->logfilesize = filesize;     /* logical file size */
    ((*fptr)->Fptr)->writemode = mode;      /* read-write mode    */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data */
    ((*fptr)->Fptr)->curbuf = -1;             /* undefined current IO buffer */
    ((*fptr)->Fptr)->open_count = 1;     /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = 0;  /* extended syntax can be used in filename */

    ffldrc(*fptr, 0, REPORT_EOF, status);     /* load first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    if (ffrhdu(*fptr, &hdutyp, status) > 0)  /* determine HDU structure */
    {
        ffpmsg(
          "ffomem could not interpret primary array header of file: (ffomem)");
        ffpmsg(url);

        if (*status == UNKNOWN_REC)
           ffpmsg("This does not look like a FITS file.");

        ffclos(*fptr, status);
        *fptr = 0;              /* return null file pointer */
    }

    /* ---------------------------------------------------------- */
    /* move to desired extension, if specified as part of the URL */
    /* ---------------------------------------------------------- */

    imagecolname[0] = '\0';
    rowexpress[0] = '\0';

    if (*extspec)
    {
       /* parse the extension specifier into individual parameters */
       ffexts(extspec, &extnum, 
         extname, &extvers, &movetotype, imagecolname, rowexpress, status);


      if (*status > 0)
          return(*status);

      if (extnum)
      {
        ffmahd(*fptr, extnum + 1, &hdutyp, status);
      }
      else if (*extname) /* move to named extension, if specified */
      {
        ffmnhd(*fptr, movetotype, extname, extvers, status);
      }

      if (*status > 0)
      {
        ffpmsg("ffomem could not move to the specified extension:");
        if (extnum > 0)
        {
          snprintf(errmsg, FLEN_ERRMSG,
          " extension number %d doesn't exist or couldn't be opened.",extnum);
          ffpmsg(errmsg);
        }
        else
        {
          snprintf(errmsg, FLEN_ERRMSG,
          " extension with EXTNAME = %s,", extname);
          ffpmsg(errmsg);

          if (extvers)
          {
             snprintf(errmsg, FLEN_ERRMSG,
             "           and with EXTVERS = %d,", extvers);
             ffpmsg(errmsg);
          }

          if (movetotype != ANY_HDU)
          {
             snprintf(errmsg, FLEN_ERRMSG,
             "           and with XTENSION = %s,", hdtype[movetotype]);
             ffpmsg(errmsg);
          }

          ffpmsg(" doesn't exist or couldn't be opened.");
        }
        return(*status);
      }
    }

    return(*status);
}